

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O1

span<int,__1L> __thiscall pstore::gsl::span<int,_-1L>::first(span<int,__1L> *this,index_type count)

{
  pointer peVar1;
  span<int,__1L> sVar2;
  extent_type<_1L> local_20 [2];
  
  if ((-1 < count) && (count <= (this->storage_).super_extent_type<_1L>.size_)) {
    peVar1 = (this->storage_).data_;
    details::extent_type<-1L>::extent_type(local_20,count);
    sVar2.storage_.data_ = peVar1;
    sVar2.storage_.super_extent_type<_1L>.size_ = local_20[0].size_;
    return (span<int,__1L>)sVar2.storage_;
  }
  assert_failed("count >= 0 && count <= size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x15f);
}

Assistant:

span<element_type, dynamic_extent> first (index_type count) const {
                PSTORE_ASSERT (count >= 0 && count <= size ());
                return {data (), count};
            }